

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tflags.h
# Opt level: O1

void __thiscall AActor::Crash(AActor *this)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  FState *newstate;
  FName labels [3];
  FName local_30;
  FName local_2c;
  FName local_28;
  FName local_24;
  FName local_20;
  undefined8 local_1c;
  int local_14;
  
  uVar2 = (this->flags6).Value;
  if (((((uVar2 >> 0x19 & 1) == 0) &&
       (uVar3 = (this->flags).Value, (uVar2 & 0x40000) != 0 || (uVar3 & 0x100000) != 0)) &&
      (-1 < (int)uVar3)) && (((this->flags3).Value & 0x200000) == 0)) {
    if ((this->DamageType).super_FName.Index == 0) {
      newstate = (FState *)0x0;
    }
    else {
      iVar4 = this->health;
      iVar5 = GetGibHealth(this);
      if (iVar4 < iVar5) {
        local_1c = 0xce0000008b;
        local_14 = (this->DamageType).super_FName.Index;
        newstate = FindState(this,3,(FName *)&local_1c,true);
      }
      else {
        newstate = (FState *)0x0;
      }
      if (newstate == (FState *)0x0) {
        local_20.Index = 0x8b;
        local_24.Index = (this->DamageType).super_FName.Index;
        newstate = FindState(this,&local_20,&local_24,true);
      }
    }
    if (newstate == (FState *)0x0) {
      iVar4 = this->health;
      iVar5 = GetGibHealth(this);
      if (iVar4 < iVar5) {
        local_28.Index = 0x8b;
        local_2c.Index = 0xce;
        newstate = FindState(this,&local_28,&local_2c,false);
      }
      else {
        local_30.Index = 0x8b;
        newstate = FindState(this,&local_30);
      }
    }
    if (newstate != (FState *)0x0) {
      SetState(this,newstate,false);
    }
    pbVar1 = (byte *)((long)&(this->flags3).Value + 2);
    *pbVar1 = *pbVar1 | 0x20;
  }
  return;
}

Assistant:

Self operator& (T value) const { return Self::FromInt (Value & value); }